

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * QUtil::path_basename(string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  long *local_48 [2];
  long local_38 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  uVar2 = __return_storage_ptr__->_M_string_length;
  while( true ) {
    if (uVar2 < 2) {
      return __return_storage_ptr__;
    }
    uVar3 = std::__cxx11::string::find_last_of
                      ((char *)__return_storage_ptr__,0x27aa01,0xffffffffffffffff);
    if (uVar3 != uVar2 - 1) break;
    std::__cxx11::string::pop_back();
    uVar2 = uVar3;
  }
  if (uVar3 == 0xffffffffffffffff) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
  if (local_48[0] == local_38) {
    return __return_storage_ptr__;
  }
  operator_delete(local_48[0],local_38[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::path_basename(std::string const& filename)
{
#ifdef _WIN32
    char const* pathsep = "/\\";
#else
    char const* pathsep = "/";
#endif
    std::string last = filename;
    auto len = last.length();
    while (len > 1) {
        auto pos = last.find_last_of(pathsep);
        if (pos == len - 1) {
            last.pop_back();
            --len;
        } else if (pos == std::string::npos) {
            break;
        } else {
            last = last.substr(pos + 1);
            break;
        }
    }
    return last;
}